

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QRotationGate1.hpp
# Opt level: O2

void __thiscall
qclab::qgates::QRotationGate1<double>::QRotationGate1
          (QRotationGate1<double> *this,int qubit,real_type theta,bool fixed)

{
  double dVar1;
  
  QGate1<double>::QGate1(&this->super_QGate1<double>,qubit);
  (this->super_QGate1<double>).field_0xc = fixed;
  (this->super_QGate1<double>).super_QObject<double>._vptr_QObject =
       (_func_int **)&PTR_nbQubits_00132260;
  dVar1 = ::cos(theta * 0.5);
  (this->rotation_).angle_.cos_ = dVar1;
  dVar1 = ::sin(theta * 0.5);
  (this->rotation_).angle_.sin_ = dVar1;
  return;
}

Assistant:

QRotationGate1( const int qubit , const real_type theta ,
                        const bool fixed = false )
        : QGate1< T >( qubit )
        , rotation_( theta )
        , QAdjustable( fixed )
        { }